

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall
QPropertyAnimation::setPropertyName(QPropertyAnimation *this,QByteArray *propertyName)

{
  bool bVar1;
  parameter_type pVar2;
  QPropertyAnimationPrivate *this_00;
  QByteArray *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QPropertyAnimationPrivate *unaff_retaddr;
  QPropertyAnimationPrivate *d;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *in_stack_00000020;
  parameter_type in_stack_ffffffffffffffb8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPropertyAnimation *)0x682f6a);
  pVar2 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x682f7d);
  if (pVar2 == Stopped) {
    QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper
              ((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                *)in_RDI);
    QPropertyData<QByteArray>::valueBypassingBindings
              (&(this_00->propertyName).super_QPropertyData<QByteArray>);
    bVar1 = ::operator==((QByteArray *)in_RDI,in_RSI);
    if (!bVar1) {
      QPropertyData<QByteArray>::setValueBypassingBindings
                ((QPropertyData<QByteArray> *)this_00,in_stack_ffffffffffffffb8);
      QPropertyAnimationPrivate::updateMetaProperty(unaff_retaddr);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
      ::notify(in_stack_00000020);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_RSI,(int)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffffb8
              );
    QMessageLogger::warning
              (&local_28,
               "QPropertyAnimation::setPropertyName: you can\'t change the property name of a running animation"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimation::setPropertyName(const QByteArray &propertyName)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setPropertyName: you can't change the property name of a running animation");
        return;
    }

    d->propertyName.removeBindingUnlessInWrapper();

    if (d->propertyName.valueBypassingBindings() == propertyName)
        return;

    d->propertyName.setValueBypassingBindings(propertyName);
    d->updateMetaProperty();
    d->propertyName.notify();
}